

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
::FinalizeAllocation
          (EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
           *this,TEmitBufferAllocation *allocation,BYTE *dstBuffer)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  BYTE *local_38;
  BYTE *buffer;
  BYTE *pBStack_28;
  DWORD bytes;
  BYTE *dstBuffer_local;
  TEmitBufferAllocation *allocation_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_FakeCriticalSection>
  *this_local;
  
  pBStack_28 = dstBuffer;
  dstBuffer_local = (BYTE *)allocation;
  allocation_local = (TEmitBufferAllocation *)this;
  bVar2 = FakeCriticalSection::IsLocked(&this->criticalSection);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,300,"(this->criticalSection.IsLocked())","this->criticalSection.IsLocked()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  buffer._4_4_ = EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                 ::BytesFree((EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
                              *)dstBuffer_local);
  if (buffer._4_4_ != 0) {
    local_38 = (BYTE *)0x0;
    GetBuffer(this,(TEmitBufferAllocation *)dstBuffer_local,(ulong)buffer._4_4_,&local_38);
    bVar2 = CommitBuffer(this,(TEmitBufferAllocation *)dstBuffer_local,
                         *(size_t *)(dstBuffer_local + 0x10),pBStack_28,0,(BYTE *)0x0,buffer._4_4_);
    if (!bVar2) {
      return false;
    }
    this->totalBytesCode = this->totalBytesCode - (ulong)buffer._4_4_;
  }
  return true;
}

Assistant:

bool EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::FinalizeAllocation(TEmitBufferAllocation *allocation, BYTE * dstBuffer)
{
    Assert(this->criticalSection.IsLocked());

    DWORD bytes = allocation->BytesFree();
    if(bytes > 0)
    {
        BYTE* buffer = nullptr;
        this->GetBuffer(allocation, bytes, &buffer);
        if (!this->CommitBuffer(allocation, allocation->bytesCommitted, dstBuffer, 0, /*sourceBuffer=*/ nullptr, /*alignPad=*/ bytes))
        {
            return false;
        }

#if DBG_DUMP
        this->totalBytesCode -= bytes;
#endif
    }

    return true;
}